

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_type.h
# Opt level: O3

bool date::rfc3339::validate(parts *dt)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  ushort uVar4;
  byte bVar5;
  bool bVar6;
  
  uVar2 = dt->year;
  if (((uVar2 == 0) || (bVar1 = dt->month, (byte)(bVar1 - 0xd) < 0xf4)) || (dt->day == 0)) {
    return false;
  }
  if (bVar1 < 0xc) {
    bVar5 = 0x1e;
    if ((0xa50U >> (bVar1 & 0x1f) & 1) != 0) goto LAB_001090db;
    if (bVar1 == 2) {
      bVar5 = 0x1c;
      if ((uVar2 & 3) == 0) {
        bVar5 = ((ushort)((ushort)(uVar2 * 0x5c29) >> 4 | uVar2 * -0x7000) < 0xa4 ||
                0x28f < (ushort)((ushort)(uVar2 * 0x5c29) >> 2 | uVar2 * 0x4000)) | 0x1c;
      }
      goto LAB_001090db;
    }
  }
  bVar5 = 0x1f;
LAB_001090db:
  bVar3 = false;
  bVar6 = false;
  if (((dt->day <= bVar5) && (bVar6 = bVar3, dt->hour < 0x18)) &&
     ((dt->minute < 0x3c && ((dt->second < 0x3c && (dt->nanosecond < 1000000000)))))) {
    uVar2 = dt->offset_in_minutes;
    uVar4 = -uVar2;
    if (0 < (short)uVar2) {
      uVar4 = uVar2;
    }
    bVar6 = uVar4 < 0x5a0;
  }
  return bVar6;
}

Assistant:

static bool validate(const parts& dt)
    {
        if (dt.year == 0)
            return false;
        if (dt.month == 0 || dt.month > 12)
            return false;
        if (dt.day == 0 || dt.day > calendar_helper::days_in_month(dt.year, dt.month))
            return false;
        if (dt.hour > 23)
            return false;
        if (dt.minute > 59)
            return false;
        if (dt.second > 59)
            return false;
        if (dt.nanosecond > 999999999)
            return false;
        if (std::abs(dt.offset_in_minutes) > 1439)
            return false;
        return true;
    }